

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HammeringPattern.cpp
# Opt level: O3

void __thiscall HammeringPattern::remove_mappings_without_bitflips(HammeringPattern *this)

{
  size_t sVar1;
  iterator __position;
  
  __position._M_current =
       (this->address_mappings).
       super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (this->address_mappings).
      super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      sVar1 = PatternAddressMapper::count_bitflips(__position._M_current);
      if (sVar1 == 0) {
        __position = std::vector<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>::
                     _M_erase(&this->address_mappings,__position);
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    } while (__position._M_current !=
             (this->address_mappings).
             super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void HammeringPattern::remove_mappings_without_bitflips() {
  for (auto it = address_mappings.begin(); it != address_mappings.end(); ) {
    if (it->count_bitflips() == 0) {
      it = address_mappings.erase(it);
    } else {
      it++;
    }
  }
}